

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenTypeFileInput.cpp
# Opt level: O0

EStatusCode __thiscall OpenTypeFileInput::ReadOS2(OpenTypeFileInput *this)

{
  ulong uVar1;
  bool bVar2;
  pointer ppVar3;
  LongFilePositionType LVar4;
  int local_38;
  int local_34;
  int i_1;
  int i;
  unsigned_long local_28;
  _Self local_20;
  iterator it;
  OpenTypeFileInput *this_local;
  
  it._M_node = (_Base_ptr)this;
  memset(&this->mOS2,0,0x88);
  local_28 = GetTag(this,"OS/2");
  local_20._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_TableEntry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_TableEntry>_>_>
       ::find(&this->mTables,&local_28);
  _i_1 = std::
         map<unsigned_long,_TableEntry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_TableEntry>_>_>
         ::end(&this->mTables);
  bVar2 = std::operator==(&local_20,(_Self *)&i_1);
  if (bVar2) {
    this->mOS2Exists = false;
    this_local._4_4_ = eSuccess;
  }
  else {
    this->mOS2Exists = true;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_TableEntry>_>::operator->
                       (&local_20);
    OpenTypePrimitiveReader::SetOffset(&this->mPrimitivesReader,(ppVar3->second).Offset);
    OpenTypePrimitiveReader::ReadUSHORT(&this->mPrimitivesReader,&(this->mOS2).Version);
    OpenTypePrimitiveReader::ReadSHORT(&this->mPrimitivesReader,&(this->mOS2).AvgCharWidth);
    OpenTypePrimitiveReader::ReadUSHORT(&this->mPrimitivesReader,&(this->mOS2).WeightClass);
    OpenTypePrimitiveReader::ReadUSHORT(&this->mPrimitivesReader,&(this->mOS2).WidthClass);
    OpenTypePrimitiveReader::ReadUSHORT(&this->mPrimitivesReader,&(this->mOS2).fsType);
    OpenTypePrimitiveReader::ReadSHORT(&this->mPrimitivesReader,&(this->mOS2).SubscriptXSize);
    OpenTypePrimitiveReader::ReadSHORT(&this->mPrimitivesReader,&(this->mOS2).SubscriptYSize);
    OpenTypePrimitiveReader::ReadSHORT(&this->mPrimitivesReader,&(this->mOS2).SubscriptXOffset);
    OpenTypePrimitiveReader::ReadSHORT(&this->mPrimitivesReader,&(this->mOS2).SubscriptYOffset);
    OpenTypePrimitiveReader::ReadSHORT(&this->mPrimitivesReader,&(this->mOS2).SuperscriptXSize);
    OpenTypePrimitiveReader::ReadSHORT(&this->mPrimitivesReader,&(this->mOS2).SuperscriptYSize);
    OpenTypePrimitiveReader::ReadSHORT(&this->mPrimitivesReader,&(this->mOS2).SuperscriptXOffset);
    OpenTypePrimitiveReader::ReadSHORT(&this->mPrimitivesReader,&(this->mOS2).SuperscriptYOffset);
    OpenTypePrimitiveReader::ReadSHORT(&this->mPrimitivesReader,&(this->mOS2).StrikeoutSize);
    OpenTypePrimitiveReader::ReadSHORT(&this->mPrimitivesReader,&(this->mOS2).StrikeoutPosition);
    OpenTypePrimitiveReader::ReadSHORT(&this->mPrimitivesReader,&(this->mOS2).FamilyClass);
    for (local_34 = 0; local_34 < 10; local_34 = local_34 + 1) {
      OpenTypePrimitiveReader::ReadBYTE(&this->mPrimitivesReader,(this->mOS2).Panose + local_34);
    }
    OpenTypePrimitiveReader::ReadULONG(&this->mPrimitivesReader,&(this->mOS2).UnicodeRange1);
    OpenTypePrimitiveReader::ReadULONG(&this->mPrimitivesReader,&(this->mOS2).UnicodeRange2);
    OpenTypePrimitiveReader::ReadULONG(&this->mPrimitivesReader,&(this->mOS2).UnicodeRange3);
    OpenTypePrimitiveReader::ReadULONG(&this->mPrimitivesReader,&(this->mOS2).UnicodeRange4);
    for (local_38 = 0; local_38 < 4; local_38 = local_38 + 1) {
      OpenTypePrimitiveReader::ReadCHAR(&this->mPrimitivesReader,(this->mOS2).AchVendID + local_38);
    }
    OpenTypePrimitiveReader::ReadUSHORT(&this->mPrimitivesReader,&(this->mOS2).FSSelection);
    OpenTypePrimitiveReader::ReadUSHORT(&this->mPrimitivesReader,&(this->mOS2).FirstCharIndex);
    OpenTypePrimitiveReader::ReadUSHORT(&this->mPrimitivesReader,&(this->mOS2).LastCharIndex);
    OpenTypePrimitiveReader::ReadSHORT(&this->mPrimitivesReader,&(this->mOS2).TypoAscender);
    OpenTypePrimitiveReader::ReadSHORT(&this->mPrimitivesReader,&(this->mOS2).TypoDescender);
    OpenTypePrimitiveReader::ReadSHORT(&this->mPrimitivesReader,&(this->mOS2).TypoLineGap);
    OpenTypePrimitiveReader::ReadUSHORT(&this->mPrimitivesReader,&(this->mOS2).WinAscent);
    OpenTypePrimitiveReader::ReadUSHORT(&this->mPrimitivesReader,&(this->mOS2).WinDescent);
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_TableEntry>_>::operator->
                       (&local_20);
    uVar1 = (ppVar3->second).Length;
    LVar4 = OpenTypePrimitiveReader::GetCurrentPosition(&this->mPrimitivesReader);
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_TableEntry>_>::operator->
                       (&local_20);
    if ((LVar4 - (ppVar3->second).Offset) + 0x12 <= uVar1) {
      OpenTypePrimitiveReader::ReadULONG(&this->mPrimitivesReader,&(this->mOS2).CodePageRange1);
      OpenTypePrimitiveReader::ReadULONG(&this->mPrimitivesReader,&(this->mOS2).CodePageRange2);
      OpenTypePrimitiveReader::ReadSHORT(&this->mPrimitivesReader,&(this->mOS2).XHeight);
      OpenTypePrimitiveReader::ReadSHORT(&this->mPrimitivesReader,&(this->mOS2).CapHeight);
      OpenTypePrimitiveReader::ReadUSHORT(&this->mPrimitivesReader,&(this->mOS2).DefaultChar);
      OpenTypePrimitiveReader::ReadUSHORT(&this->mPrimitivesReader,&(this->mOS2).BreakChar);
      OpenTypePrimitiveReader::ReadUSHORT(&this->mPrimitivesReader,&(this->mOS2).MaxContext);
    }
    this_local._4_4_ = OpenTypePrimitiveReader::GetInternalState(&this->mPrimitivesReader);
  }
  return this_local._4_4_;
}

Assistant:

EStatusCode OpenTypeFileInput::ReadOS2()
{
	memset(&mOS2,0,sizeof(OS2Table));

	ULongToTableEntryMap::iterator it = mTables.find(GetTag("OS/2"));
	if(it == mTables.end())
	{
        mOS2Exists = false;
        return eSuccess;
	}
    
    mOS2Exists = true;

	mPrimitivesReader.SetOffset(it->second.Offset);


	mPrimitivesReader.ReadUSHORT(mOS2.Version);
	mPrimitivesReader.ReadSHORT(mOS2.AvgCharWidth);
	mPrimitivesReader.ReadUSHORT(mOS2.WeightClass);
	mPrimitivesReader.ReadUSHORT(mOS2.WidthClass);
	mPrimitivesReader.ReadUSHORT(mOS2.fsType);

	mPrimitivesReader.ReadSHORT(mOS2.SubscriptXSize);
	mPrimitivesReader.ReadSHORT(mOS2.SubscriptYSize);
	mPrimitivesReader.ReadSHORT(mOS2.SubscriptXOffset);
	mPrimitivesReader.ReadSHORT(mOS2.SubscriptYOffset);
	mPrimitivesReader.ReadSHORT(mOS2.SuperscriptXSize);
	mPrimitivesReader.ReadSHORT(mOS2.SuperscriptYSize);
	mPrimitivesReader.ReadSHORT(mOS2.SuperscriptXOffset);
	mPrimitivesReader.ReadSHORT(mOS2.SuperscriptYOffset);
	mPrimitivesReader.ReadSHORT(mOS2.StrikeoutSize);
	mPrimitivesReader.ReadSHORT(mOS2.StrikeoutPosition);
	mPrimitivesReader.ReadSHORT(mOS2.FamilyClass);
	for(int i=0; i <10; ++i)
		mPrimitivesReader.ReadBYTE(mOS2.Panose[i]);
	mPrimitivesReader.ReadULONG(mOS2.UnicodeRange1);
	mPrimitivesReader.ReadULONG(mOS2.UnicodeRange2);
	mPrimitivesReader.ReadULONG(mOS2.UnicodeRange3);
	mPrimitivesReader.ReadULONG(mOS2.UnicodeRange4);
	for(int i=0; i <4; ++i)
		mPrimitivesReader.ReadCHAR(mOS2.AchVendID[i]);
	mPrimitivesReader.ReadUSHORT(mOS2.FSSelection);
	mPrimitivesReader.ReadUSHORT(mOS2.FirstCharIndex);
	mPrimitivesReader.ReadUSHORT(mOS2.LastCharIndex);
	mPrimitivesReader.ReadSHORT(mOS2.TypoAscender);
	mPrimitivesReader.ReadSHORT(mOS2.TypoDescender);
	mPrimitivesReader.ReadSHORT(mOS2.TypoLineGap);
	mPrimitivesReader.ReadUSHORT(mOS2.WinAscent);
	mPrimitivesReader.ReadUSHORT(mOS2.WinDescent);

	// version 1 OS/2 table may end here [see that there's enough to continue]
	if(it->second.Length >= (mPrimitivesReader.GetCurrentPosition() - it->second.Offset) + 18)
	{
		mPrimitivesReader.ReadULONG(mOS2.CodePageRange1);
		mPrimitivesReader.ReadULONG(mOS2.CodePageRange2);
		mPrimitivesReader.ReadSHORT(mOS2.XHeight);
		mPrimitivesReader.ReadSHORT(mOS2.CapHeight);
		mPrimitivesReader.ReadUSHORT(mOS2.DefaultChar);
		mPrimitivesReader.ReadUSHORT(mOS2.BreakChar);
		mPrimitivesReader.ReadUSHORT(mOS2.MaxContext);
	}
	return mPrimitivesReader.GetInternalState();	
}